

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_gc.c
# Opt level: O2

void zt_gc_collect(zt_gc_t *gc,int full_scan)

{
  uint uVar1;
  zt_gc_collectable_t *pzVar2;
  zt_elist *pzVar3;
  zt_elist *pzVar4;
  zt_gc_collectable_t *pzVar5;
  zt_elist_t *pzVar6;
  zt_gc_collectable_t *pzVar7;
  code *pcVar8;
  code *pcVar9;
  code *pcVar10;
  int iVar11;
  bool bVar12;
  zt_elist *local_28;
  
  uVar1 = gc->enabled;
  local_28 = (zt_elist *)(ulong)uVar1;
  if (((int)uVar1 < 0) || ((full_scan == 0 && (gc->current_allocs < gc->allocs_before_scan)))) {
    return;
  }
  gc->enabled = uVar1 - 1;
  gc->current_allocs = 0;
  pzVar5 = (zt_gc_collectable_t *)gc->scan;
  if (pzVar5 == (zt_gc_collectable_t *)gc->grey) {
    pzVar5 = (zt_gc_collectable_t *)(pzVar5->list).next;
    gc->scan = (zt_elist_t *)pzVar5;
  }
  iVar11 = 0;
  pzVar7 = (zt_gc_collectable_t *)gc->grey;
  do {
    while( true ) {
      if (pzVar5 == pzVar7) {
        pzVar6 = gc->white;
        local_28 = pzVar6->next;
        if (local_28 != pzVar6) {
          while (local_28 != pzVar6) {
            pzVar3 = local_28->prev;
            pzVar4 = local_28->next;
            pzVar4->prev = pzVar3;
            pzVar3->next = pzVar4;
            (*gc->release_fn)(gc,gc->private_data,&local_28);
            local_28 = pzVar4;
            pzVar6 = gc->white;
          }
        }
        iVar11 = gc->enabled;
        gc->white = gc->black;
        bVar12 = gc->is_white != one_is_white;
        pcVar8 = zero_is_white;
        if (bVar12) {
          pcVar8 = one_is_white;
        }
        pcVar9 = one_clear_white;
        if (!bVar12) {
          pcVar9 = zero_clear_white;
        }
        pcVar10 = one_set_white;
        if (!bVar12) {
          pcVar10 = zero_set_white;
        }
        gc->black = pzVar6;
        gc->is_white = pcVar8;
        gc->clear_white = pcVar9;
        gc->set_white = pcVar10;
        goto LAB_001060c7;
      }
      (*gc->clear_white)(pzVar5);
      (*gc->mark_fn)(gc,gc->private_data,pzVar5);
      pzVar2 = (zt_gc_collectable_t *)gc->scan->next;
      if ((pzVar5->colour & 2) == 0) {
        pzVar3 = (pzVar5->list).prev;
        pzVar4 = (pzVar5->list).next;
        pzVar4->prev = pzVar3;
        pzVar3->next = pzVar4;
        pzVar3 = gc->black;
        pzVar4 = pzVar3->next;
        pzVar4->prev = &pzVar5->list;
        (pzVar5->list).next = pzVar4;
        (pzVar5->list).prev = pzVar3;
        pzVar3->next = &pzVar5->list;
      }
      gc->scan = (zt_elist_t *)pzVar2;
      pzVar5 = pzVar2;
      if (full_scan == 0) break;
      pzVar7 = (zt_gc_collectable_t *)gc->grey;
    }
    iVar11 = iVar11 + 1;
    pzVar7 = (zt_gc_collectable_t *)gc->grey;
  } while ((iVar11 < gc->marks_per_scan) ||
          (pzVar7 = pzVar2, pzVar2 == (zt_gc_collectable_t *)gc->grey));
  iVar11 = gc->enabled;
LAB_001060c7:
  gc->enabled = iVar11 + 1;
  return;
}

Assistant:

void
zt_gc_collect(zt_gc_t *gc, int full_scan)
{
    int current_marks = 0;

    if (gc->enabled < 0 ||
        (!full_scan && gc->current_allocs < gc->allocs_before_scan)) {
        return;
    }

    gc->enabled--;

#if DEBUG_SCAN
    printf("\n== Start Scan ==\n");
    zt_gc_print_heap(gc);
#endif /* DEBUG_SCAN */

    gc->current_allocs = 0;

    if (gc->scan == gc->grey) {
        /* beginning of a scan */
        gc->scan = gc->scan->next;
    }

    while (gc->scan != gc->grey) {
        /* move thru each object in the grey list moving it to the
         * black list and marking it as we go.
         */
        zt_elist_t          * next;
        zt_elist_t          * elt;
        zt_gc_collectable_t * mark;

        elt = gc->scan;

        mark = zt_elist_data(elt, zt_gc_collectable_t, list);

        gc->clear_white(mark);
        gc->mark_fn(gc, gc->private_data, elt);

        next = gc->scan->next;

        if (!is_protected(mark)) {
            /* if it is protected leave it in the grey list
             * otherwise move it to black
             */
            zt_elist_remove(elt);
            zt_elist_add(gc->black, elt);
        }

        gc->scan = next;

        if (!full_scan && ++current_marks >= gc->marks_per_scan) {
            if (gc->scan != gc->grey) {
                gc->enabled++;
#if DEBUG_SCAN
                printf("------\n");
                zt_gc_print_heap(gc);
                printf("== End Scan (Partial) ==\n\n");
#endif /* DEBUG_SCAN */
                return;
            }
        }
    }

    gc->enabled++;
#if DEBUG_SCAN
    printf("------\n");
    zt_gc_print_heap(gc);
    printf("== End Scan (Full) ==\n\n");
#endif /* DEBUG_SCAN */
    zt_gc_switch(gc);
}